

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.h
# Opt level: O0

int cdef_sb_skip(CommonModeInfoParams *mi_params,int fbr,int fbc)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  uint in_EDX;
  uint in_ESI;
  CommonModeInfoParams *in_RDI;
  MB_MODE_INFO *mbmi;
  int local_4;
  
  pMVar1 = in_RDI->mi_grid_base[(int)(in_ESI * 0x10 * in_RDI->mi_stride + in_EDX * 0x10)];
  iVar2 = sb_all_skip(in_RDI,in_ESI << 4,in_EDX << 4);
  if (iVar2 == 0) {
    if ((((in_EDX & 1) == 0) ||
        ((pMVar1->bsize != BLOCK_128X128 && (pMVar1->bsize != BLOCK_128X64)))) &&
       (((in_ESI & 1) == 0 || ((pMVar1->bsize != BLOCK_128X128 && (pMVar1->bsize != BLOCK_64X128))))
       )) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int cdef_sb_skip(const CommonModeInfoParams *const mi_params,
                               int fbr, int fbc) {
  const MB_MODE_INFO *const mbmi =
      mi_params->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                              MI_SIZE_64X64 * fbc];
  // No filtering if the entire filter block is skipped.
  if (sb_all_skip(mi_params, fbr * MI_SIZE_64X64, fbc * MI_SIZE_64X64))
    return 1;
  // Skip odd numbered 64x64 block rows(cols) when bsize is BLOCK_128X128,
  // BLOCK_64X128(BLOCK_128X128, BLOCK_128X64) as for such blocks CDEF filtering
  // is done at the corresponding block sizes.
  if (((fbc & 1) &&
       (mbmi->bsize == BLOCK_128X128 || mbmi->bsize == BLOCK_128X64)) ||
      ((fbr & 1) &&
       (mbmi->bsize == BLOCK_128X128 || mbmi->bsize == BLOCK_64X128)))
    return 1;
  return 0;
}